

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,for_in_statement *s)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  int iVar1;
  pointer pbVar2;
  statement *psVar3;
  expression *e;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  long *plVar7;
  object *poVar8;
  pointer psVar9;
  object_ptr o;
  label_set ls;
  value ev_1;
  object_ptr o_1;
  value ev;
  completion c;
  undefined1 local_168 [16];
  label_set local_158;
  vector<mjs::string,_std::allocator<mjs::string>_> local_138;
  undefined1 local_120 [8];
  undefined1 local_118 [40];
  size_t local_f0;
  wchar_t *pwStack_e8;
  undefined1 local_e0 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_d8;
  pointer local_b8;
  expression *local_b0;
  gc_heap_ptr_untyped local_a8;
  value local_98;
  completion local_70;
  
  local_158.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((for_in_statement *)this->labels_valid_for_ == s) {
    local_158.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_158.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_158.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pbVar2 = (this->label_set_).
             super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->label_set_).
        super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
      (this->label_set_).
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    }
  }
  this->labels_valid_for_ = (statement *)0x0;
  this_00 = &this->global_;
  pvVar6 = gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  iVar1 = *(int *)((long)pvVar6 + 0x20);
  completion::completion(&local_70,(value *)&value::undefined,normal);
  iVar5 = (**(code **)((long)(((s->init_)._M_t.
                               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                               .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                             super_syntax_node)._vptr_syntax_node + 0x18))();
  if (iVar5 == 4) {
    eval((value *)local_120,this,
         (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_98,this,(value *)local_120);
    value::destroy((value *)local_120);
    if ((1 < iVar1) && (local_98.type_ < boolean)) {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
      value::destroy(&local_98);
      goto LAB_0011f82c;
    }
    plVar7 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar7 + 0x88))(local_168,plVar7,&local_98);
    local_b0 = (expression *)
               (s->init_)._M_t.
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl[1].super_syntax_node.
               _vptr_syntax_node;
    poVar8 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_168);
    object::enumerable_property_names(&local_138,poVar8);
    bVar4 = true;
    local_b8 = local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar9 = local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        eval((value *)local_120,this,local_b0);
        local_e0._0_4_ = string;
        local_d8.n_ = (double)(psVar9->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.
                              heap_;
        local_d8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
             (psVar9->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
        if (local_d8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
            (gc_heap *)0x0) {
          gc_heap::attach(local_d8.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                          heap_,(gc_heap_ptr_untyped *)(local_e0 + 8));
        }
        put_value(this,(value *)local_120,(value *)local_e0);
        value::destroy((value *)local_e0);
        value::destroy((value *)local_120);
        eval((completion *)local_120,this,
             (s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        local_70.type = local_120._0_4_;
        value::operator=(&local_70.result,(value *)local_118);
        local_70.target._M_len = local_f0;
        local_70.target._M_str = pwStack_e8;
        value::destroy((value *)local_118);
        bVar4 = handle_completion(&local_70,&local_158);
        if (bVar4) {
          __return_storage_ptr__->type = local_70.type;
          value::value(&__return_storage_ptr__->result,&local_70.result);
          (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
          (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
          bVar4 = false;
          goto LAB_0011f7e3;
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != local_b8);
      bVar4 = true;
    }
LAB_0011f7e3:
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_168);
    value::destroy(&local_98);
  }
  else {
    iVar5 = (**(code **)((long)(((s->init_)._M_t.
                                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                 .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                               super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar5 != 1) {
      __assert_fail("s.init().type() == statement_type::variable",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,999,"completion mjs::interpreter::impl::operator()(const for_in_statement &)");
    }
    psVar3 = (s->init_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_168._8_8_ = psVar3[1].super_syntax_node._vptr_syntax_node;
    if (*(long *)&psVar3[1].super_syntax_node.extend_.file.
                  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> - local_168._8_8_
        != 0x28) {
      __assert_fail("var_statement.l().size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x3e9,"completion mjs::interpreter::impl::operator()(const for_in_statement &)"
                   );
    }
    e = (((value_type *)local_168._8_8_)->init_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
    local_168._0_8_ = this;
    if (e == (expression *)0x0) {
      value::value((value *)local_120,(value *)&value::undefined);
    }
    else {
      eval(&local_98,this,e);
      get_value((value *)local_120,this,&local_98);
    }
    operator()::anon_class_16_2_3fe14ecb::operator()
              ((anon_class_16_2_3fe14ecb *)local_168,(value *)local_120);
    value::destroy((value *)local_120);
    if (e != (expression *)0x0) {
      value::destroy(&local_98);
    }
    eval((value *)local_120,this,
         (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value((value *)local_e0,this,(value *)local_120);
    value::destroy((value *)local_120);
    if ((1 < iVar1) && ((uint)local_e0._0_4_ < boolean)) {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
      value::destroy((value *)local_e0);
      goto LAB_0011f82c;
    }
    plVar7 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar7 + 0x88))(&local_a8,plVar7,local_e0);
    poVar8 = (object *)gc_heap_ptr_untyped::get(&local_a8);
    object::enumerable_property_names(&local_138,poVar8);
    bVar4 = true;
    if (local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar9 = local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_120._0_4_ = throw_;
        local_118._0_8_ =
             (psVar9->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
        local_118._8_4_ = (psVar9->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_
        ;
        if ((gc_heap *)local_118._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_118._0_8_,(gc_heap_ptr_untyped *)local_118);
        }
        operator()::anon_class_16_2_3fe14ecb::operator()
                  ((anon_class_16_2_3fe14ecb *)local_168,(value *)local_120);
        value::destroy((value *)local_120);
        eval((completion *)local_120,this,
             (s->s_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
        local_70.type = local_120._0_4_;
        value::operator=(&local_70.result,(value *)local_118);
        local_70.target._M_len = local_f0;
        local_70.target._M_str = pwStack_e8;
        value::destroy((value *)local_118);
        bVar4 = handle_completion(&local_70,&local_158);
        if (bVar4) {
          __return_storage_ptr__->type = local_70.type;
          value::value(&__return_storage_ptr__->result,&local_70.result);
          (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
          (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
          bVar4 = false;
          goto LAB_0011f78f;
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != local_138.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      bVar4 = true;
    }
LAB_0011f78f:
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_138);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    value::destroy((value *)local_e0);
  }
  if (bVar4) {
    __return_storage_ptr__->type = local_70.type;
    value::value(&__return_storage_ptr__->result,&local_70.result);
    (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
    (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
  }
LAB_0011f82c:
  value::destroy(&local_70.result);
  if (local_158.
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const for_in_statement& s) {
        const auto ls = get_labels(s);

        // In ES5.1 for (?? in null/undefined) is just a no-op
        auto skip = [ver = global_->language_version()](value_type t) { return ver >= version::es5 && (t == value_type::undefined || t == value_type::null); };

        completion c{};
        if (s.init().type() == statement_type::expression) {
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);
            const auto& lhs_expression = static_cast<const expression_statement&>(s.init()).e();
            for (const auto& n: o->enumerable_property_names()) {
                put_value(eval(lhs_expression), value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        } else {
            assert(s.init().type() == statement_type::variable);
            const auto& var_statement = static_cast<const variable_statement&>(s.init());
            assert(var_statement.l().size() == 1);
            const auto& init = var_statement.l()[0];

            auto assign = [&](const value& val) {
                put_value(value{active_scope_->lookup(init.id())}, val);
            };

            assign(init.init() ? get_value(eval(*init.init())) : value::undefined);

            // Happens after the initial assignment
            auto ev = get_value(eval(s.e()));
            if (skip(ev.type())) {
                return completion{};
            }
            auto o = global_->to_object(ev);

            for (const auto& n: o->enumerable_property_names()) {
                assign(value{n});
                c = eval(s.s());
                if (handle_completion(c, ls)) {
                    return c;
                }
            }
        }
        return c;
    }